

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>_>::
MapSorterFlat(MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>_>
              *this,Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *m)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  type ppVar6;
  type ppVar7;
  pair<int,_const_void_*> *local_f0;
  pair<int,_const_void_*> *local_d8;
  reference local_a0;
  pair<int,_const_void_*> local_98;
  reference local_88;
  value_type *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *__range3;
  storage_type *it;
  Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *m_local;
  MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>_>
  *this_local;
  
  sVar4 = UntypedMapBase::size((UntypedMapBase *)m);
  this->size_ = sVar4;
  if (this->size_ == 0) {
    local_f0 = (pair<int,_const_void_*> *)0x0;
  }
  else {
    uVar1 = this->size_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_f0 = (pair<int,_const_void_*> *)operator_new__(uVar5);
    if (uVar1 != 0) {
      local_d8 = local_f0;
      do {
        std::pair<int,_const_void_*>::pair<int,_const_void_*,_true>(local_d8);
        local_d8 = local_d8 + 1;
      } while (local_d8 != local_f0 + uVar1);
    }
  }
  std::unique_ptr<std::pair<int,void_const*>[],std::default_delete<std::pair<int,void_const*>[]>>::
  unique_ptr<std::pair<int,void_const*>*,std::default_delete<std::pair<int,void_const*>[]>,void,bool>
            ((unique_ptr<std::pair<int,void_const*>[],std::default_delete<std::pair<int,void_const*>[]>>
              *)&this->items_,local_f0);
  if (this->size_ != 0) {
    __range3 = (Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *)
               std::
               unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
               ::operator[](&this->items_,0);
    Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::begin
              ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,m);
    Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::end((const_iterator *)&entry,m);
    while (bVar3 = protobuf::operator!=
                             ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                              (const_iterator *)&entry), bVar3) {
      local_a0 = Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::const_iterator::operator*
                           ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
      local_88 = local_a0;
      std::pair<int,_const_void_*>::
      pair<const_std::pair<const_int,_proto2_unittest::Proto2MapEnumPlusExtraLite>_*,_true>
                (&local_98,&local_a0->first,&local_a0);
      std::pair<int,_const_void_*>::operator=((pair<int,_const_void_*> *)__range3,&local_98);
      Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::const_iterator::operator++
                ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
      __range3 = (Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *)
                 &(__range3->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_;
    }
    ppVar6 = std::
             unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
             ::operator[](&this->items_,0);
    ppVar7 = std::
             unique_ptr<std::pair<int,_const_void_*>[],_std::default_delete<std::pair<int,_const_void_*>[]>_>
             ::operator[](&this->items_,this->size_);
    std::sort<std::pair<int,void_const*>*,google::protobuf::internal::MapSorterLessThan<int>>
              (ppVar6,ppVar7);
  }
  return;
}

Assistant:

explicit MapSorterFlat(const MapT& m)
      : size_(m.size()), items_(size_ ? new storage_type[size_] : nullptr) {
    if (!size_) return;
    storage_type* it = &items_[0];
    for (const auto& entry : m) {
      *it++ = {entry.first, &entry};
    }
    std::sort(&items_[0], &items_[size_],
              MapSorterLessThan<typename MapT::key_type>{});
  }